

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::KillLiveFields
          (GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *fieldsToKill,
          BVSparse<Memory::JitArenaAllocator> *bv)

{
  Loop *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Loop **ppLVar5;
  
  if (bv == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0xc2,"(bv)","bv");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (fieldsToKill != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>(bv,fieldsToKill);
    if (this->prePassLoop != (Loop *)0x0) {
      ppLVar5 = &this->rootLoopPrePass;
      while (pLVar1 = *ppLVar5, pLVar1 != (Loop *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                  (pLVar1->fieldKilled,fieldsToKill);
        ppLVar5 = &pLVar1->parent;
      }
    }
  }
  return;
}

Assistant:

void GlobOpt::KillLiveFields(BVSparse<JitArenaAllocator> *const fieldsToKill, BVSparse<JitArenaAllocator> *const bv) const
{
    Assert(bv);

    if (fieldsToKill)
    {
        bv->Minus(fieldsToKill);

        if (this->IsLoopPrePass())
        {
            for (Loop * loop = this->rootLoopPrePass; loop != nullptr; loop = loop->parent)
            {
                loop->fieldKilled->Or(fieldsToKill);
            }
        }
    }
}